

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_posfix(FuncState *fs,BinOpr opr,expdesc *e1,expdesc *e2,int line)

{
  anon_union_8_6_45a55102_for_u aVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int *l1;
  uint uVar5;
  OpCode OVar6;
  uint *puVar7;
  bool bVar8;
  BinOpr BStackY_60;
  TMS event;
  int local_50;
  int local_4c;
  int im;
  anon_union_8_6_45a55102_for_u aStack_40;
  undefined8 local_38;
  
  luaK_dischargevars(fs,e2);
  if ((opr < OPR_CONCAT) && (iVar3 = constfolding(fs,opr,e1,e2), iVar3 != 0)) {
    return;
  }
  switch(opr) {
  case OPR_ADD:
  case OPR_MUL:
    iVar3 = tonumeral(e1,(TValue *)0x0);
    if (iVar3 != 0) {
      local_38._0_4_ = e1->t;
      local_38._4_4_ = e1->f;
      _im = *(undefined8 *)e1;
      aStack_40 = e1->u;
      iVar4 = e2->f;
      e1->t = e2->t;
      e1->f = iVar4;
      uVar2 = *(undefined4 *)&e2->field_0x4;
      aVar1 = e2->u;
      e1->k = e2->k;
      *(undefined4 *)&e1->field_0x4 = uVar2;
      e1->u = aVar1;
      e2->t = (undefined4)local_38;
      e2->f = local_38._4_4_;
      *(undefined8 *)e2 = _im;
      e2->u = aStack_40;
    }
    uVar5 = (uint)(iVar3 != 0);
    if ((opr != OPR_ADD) || (iVar3 = isSCint(e2), iVar3 == 0)) goto LAB_00117f04;
    event = TM_ADD;
    OVar6 = OP_ADDI;
    break;
  case OPR_SUB:
    iVar3 = finishbinexpneg(fs,e1,e2,OP_ADDI,line,TM_SUB);
    if (iVar3 != 0) {
      return;
    }
  case OPR_MOD:
  case OPR_POW:
  case OPR_DIV:
  case OPR_IDIV:
    uVar5 = 0;
LAB_00117f04:
    codearith(fs,opr,e1,e2,uVar5,line);
    return;
  case OPR_BAND:
  case OPR_BOR:
  case OPR_BXOR:
    bVar8 = e1->k == VKINT;
    if (bVar8) {
      local_38._0_4_ = e1->t;
      local_38._4_4_ = e1->f;
      _im = *(undefined8 *)e1;
      aStack_40 = e1->u;
      iVar3 = e2->f;
      e1->t = e2->t;
      e1->f = iVar3;
      uVar2 = *(undefined4 *)&e2->field_0x4;
      aVar1 = e2->u;
      e1->k = e2->k;
      *(undefined4 *)&e1->field_0x4 = uVar2;
      e1->u = aVar1;
      e2->t = (undefined4)local_38;
      e2->f = local_38._4_4_;
      *(undefined8 *)e2 = _im;
      e2->u = aStack_40;
    }
    uVar5 = (uint)bVar8;
    if ((e2->k == VKINT) && (iVar3 = luaK_exp2K(fs,e2), iVar3 != 0)) {
      codebinK(fs,opr,e1,e2,uVar5,line);
      return;
    }
    codebinNoK(fs,opr,e1,e2,uVar5,line);
    return;
  case OPR_SHL:
    iVar3 = isSCint(e1);
    if (iVar3 == 0) {
      iVar3 = finishbinexpneg(fs,e1,e2,OP_SHRI,line,TM_SHL);
      if (iVar3 != 0) {
        return;
      }
      BStackY_60 = OPR_SHL;
LAB_00118260:
      codebinexpval(fs,BStackY_60,e1,e2,line);
      return;
    }
    local_38._0_4_ = e1->t;
    local_38._4_4_ = e1->f;
    _im = *(undefined8 *)e1;
    aStack_40 = e1->u;
    iVar3 = e2->f;
    e1->t = e2->t;
    e1->f = iVar3;
    uVar2 = *(undefined4 *)&e2->field_0x4;
    aVar1 = e2->u;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar2;
    e1->u = aVar1;
    e2->t = (undefined4)local_38;
    e2->f = local_38._4_4_;
    *(undefined8 *)e2 = _im;
    e2->u = aStack_40;
    event = TM_SHL;
    OVar6 = OP_SHLI;
    uVar5 = 1;
    break;
  case OPR_SHR:
    iVar3 = isSCint(e2);
    if (iVar3 == 0) {
      BStackY_60 = OPR_SHR;
      goto LAB_00118260;
    }
    event = TM_SHR;
    OVar6 = OP_SHRI;
    uVar5 = 0;
    break;
  case OPR_CONCAT:
    luaK_exp2nextreg(fs,e2);
    if (fs->lasttarget < fs->pc) {
      puVar7 = fs->f->code + (long)fs->pc + -1;
    }
    else {
      puVar7 = &previousinstruction_invalidinstruction;
    }
    uVar5 = *puVar7;
    if ((uVar5 & 0x7f) == 0x35) {
      freeexp(fs,e2);
      *puVar7 = uVar5 + 0x10000 & 0xff0000 | *puVar7 & 0xff00807f | ((e1->u).info & 0xffU) << 7;
      return;
    }
    luaK_code(fs,(e1->u).info << 7 | 0x20035);
    freeexp(fs,e2);
    luaK_fixline(fs,line);
    return;
  case OPR_EQ:
  case OPR_NE:
    local_4c = 0;
    if (e1->k != VNONRELOC) {
      local_38._0_4_ = e1->t;
      local_38._4_4_ = e1->f;
      _im = *(undefined8 *)e1;
      aStack_40 = e1->u;
      iVar3 = e2->f;
      e1->t = e2->t;
      e1->f = iVar3;
      uVar2 = *(undefined4 *)&e2->field_0x4;
      aVar1 = e2->u;
      e1->k = e2->k;
      *(undefined4 *)&e1->field_0x4 = uVar2;
      e1->u = aVar1;
      e2->t = (undefined4)local_38;
      e2->f = local_38._4_4_;
      *(undefined8 *)e2 = _im;
      e2->u = aStack_40;
    }
    local_50 = luaK_exp2anyreg(fs,e1);
    iVar3 = isSCnumber(e2,&im,&local_4c);
    if (iVar3 == 0) {
      iVar3 = exp2RK(fs,e2);
      if (iVar3 == 0) {
        iVar4 = luaK_exp2anyreg(fs,e2);
        OVar6 = OP_EQ;
      }
      else {
        iVar4 = (e2->u).info;
        OVar6 = OP_EQK;
      }
    }
    else {
      OVar6 = OP_EQI;
      iVar4 = im;
    }
    freeexps(fs,e1,e2);
    uVar5 = (uint)(opr == OPR_EQ);
    goto LAB_001182af;
  case OPR_LT:
  case OPR_LE:
    goto switchD_00117df7_caseD_e;
  case OPR_GT:
  case OPR_GE:
    local_38._0_4_ = e1->t;
    local_38._4_4_ = e1->f;
    _im = *(undefined8 *)e1;
    aStack_40 = e1->u;
    iVar3 = e2->f;
    e1->t = e2->t;
    e1->f = iVar3;
    uVar2 = *(undefined4 *)&e2->field_0x4;
    aVar1 = e2->u;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar2;
    e1->u = aVar1;
    e2->t = (undefined4)local_38;
    e2->f = local_38._4_4_;
    *(undefined8 *)e2 = _im;
    e2->u = aStack_40;
    opr = opr - OPR_MOD;
switchD_00117df7_caseD_e:
    local_4c = 0;
    iVar3 = isSCnumber(e2,&im,&local_4c);
    if (iVar3 == 0) {
      iVar3 = isSCnumber(e1,&im,&local_4c);
      if (iVar3 != 0) {
        local_50 = luaK_exp2anyreg(fs,e2);
        iVar3 = 0x32;
        goto LAB_0011801d;
      }
      local_50 = luaK_exp2anyreg(fs,e1);
      iVar4 = luaK_exp2anyreg(fs,e2);
      iVar3 = 0x2c;
    }
    else {
      local_50 = luaK_exp2anyreg(fs,e1);
      iVar3 = 0x30;
LAB_0011801d:
      iVar4 = im;
    }
    OVar6 = iVar3 + opr;
    freeexps(fs,e1,e2);
    uVar5 = 1;
LAB_001182af:
    iVar3 = condjump(fs,OVar6,local_50,iVar4,local_4c,uVar5);
    (e1->u).info = iVar3;
    e1->k = VJMP;
    return;
  case OPR_AND:
    l1 = &e2->f;
    iVar3 = e1->f;
    goto LAB_0011812b;
  case OPR_OR:
    l1 = &e2->t;
    iVar3 = e1->t;
LAB_0011812b:
    luaK_concat(fs,l1,iVar3);
    iVar3 = e2->f;
    e1->t = e2->t;
    e1->f = iVar3;
    uVar2 = *(undefined4 *)&e2->field_0x4;
    aVar1 = e2->u;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar2;
    e1->u = aVar1;
  default:
    goto LAB_001182ca;
  }
  codebini(fs,OVar6,e1,e2,uVar5,line,event);
LAB_001182ca:
  return;
}

Assistant:

void luaK_posfix (FuncState *fs, BinOpr opr,
                  expdesc *e1, expdesc *e2, int line) {
  luaK_dischargevars(fs, e2);
  if (foldbinop(opr) && constfolding(fs, opr + LUA_OPADD, e1, e2))
    return;  /* done by folding */
  switch (opr) {
    case OPR_AND: {
      lua_assert(e1->t == NO_JUMP);  /* list closed by 'luaK_infix' */
      luaK_concat(fs, &e2->f, e1->f);
      *e1 = *e2;
      break;
    }
    case OPR_OR: {
      lua_assert(e1->f == NO_JUMP);  /* list closed by 'luaK_infix' */
      luaK_concat(fs, &e2->t, e1->t);
      *e1 = *e2;
      break;
    }
    case OPR_CONCAT: {  /* e1 .. e2 */
      luaK_exp2nextreg(fs, e2);
      codeconcat(fs, e1, e2, line);
      break;
    }
    case OPR_ADD: case OPR_MUL: {
      codecommutative(fs, opr, e1, e2, line);
      break;
    }
    case OPR_SUB: {
      if (finishbinexpneg(fs, e1, e2, OP_ADDI, line, TM_SUB))
        break; /* coded as (r1 + -I) */
      /* ELSE */
    }  /* FALLTHROUGH */
    case OPR_DIV: case OPR_IDIV: case OPR_MOD: case OPR_POW: {
      codearith(fs, opr, e1, e2, 0, line);
      break;
    }
    case OPR_BAND: case OPR_BOR: case OPR_BXOR: {
      codebitwise(fs, opr, e1, e2, line);
      break;
    }
    case OPR_SHL: {
      if (isSCint(e1)) {
        swapexps(e1, e2);
        codebini(fs, OP_SHLI, e1, e2, 1, line, TM_SHL);  /* I << r2 */
      }
      else if (finishbinexpneg(fs, e1, e2, OP_SHRI, line, TM_SHL)) {
        /* coded as (r1 >> -I) */;
      }
      else  /* regular case (two registers) */
       codebinexpval(fs, opr, e1, e2, line);
      break;
    }
    case OPR_SHR: {
      if (isSCint(e2))
        codebini(fs, OP_SHRI, e1, e2, 0, line, TM_SHR);  /* r1 >> I */
      else  /* regular case (two registers) */
        codebinexpval(fs, opr, e1, e2, line);
      break;
    }
    case OPR_EQ: case OPR_NE: {
      codeeq(fs, opr, e1, e2);
      break;
    }
    case OPR_GT: case OPR_GE: {
      /* '(a > b)' <=> '(b < a)';  '(a >= b)' <=> '(b <= a)' */
      swapexps(e1, e2);
      opr = cast(BinOpr, (opr - OPR_GT) + OPR_LT);
    }  /* FALLTHROUGH */
    case OPR_LT: case OPR_LE: {
      codeorder(fs, opr, e1, e2);
      break;
    }
    default: lua_assert(0);
  }
}